

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

void Aig_ManDfsReverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Aig_Obj_t *pObj_00;
  uint uVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b4,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar3 = p->nTravIds;
  iVar5 = pObj->TravId;
  if (iVar5 != iVar3) {
    uVar6 = (uint)*(ulong *)&pObj->field_0x18 & 7;
    if ((uVar6 != 4) && (1 < uVar6 - 5)) {
      __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x1b7,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if (p->pFanData == (int *)0x0) {
      __assert_fail("p->pFanData",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x1b8,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if ((*(ulong *)&pObj->field_0x18 & 0xffffffc0) != 0) {
      uVar6 = 0xffffffff;
      uVar7 = 0;
      do {
        if (uVar7 == 0) {
          if (p->nFansAlloc <= pObj->Id) {
            __assert_fail("ObjId < p->nFansAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
          }
          iVar3 = pObj->Id * 5;
        }
        else {
          if (p->nFansAlloc <= (int)uVar6 / 2) {
            __assert_fail("iFan/2 < p->nFansAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
          }
          iVar3 = ((int)uVar6 >> 1) * 5 + (uVar6 & 1) + 3;
        }
        pVVar1 = p->vObjs;
        uVar6 = p->pFanData[iVar3];
        if (pVVar1 == (Vec_Ptr_t *)0x0) {
          pObj_00 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar4 = (int)uVar6 >> 1;
          if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj_00 = (Aig_Obj_t *)pVVar1->pArray[uVar4];
        }
        Aig_ManDfsReverse_rec(p,pObj_00,vNodes);
        uVar7 = uVar7 + 1;
      } while (uVar7 < *(uint *)&pObj->field_0x18 >> 6);
      iVar3 = p->nTravIds;
      iVar5 = pObj->TravId;
    }
    if (iVar5 == iVar3) {
      __assert_fail("!Aig_ObjIsTravIdCurrent(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x1ba,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    pObj->TravId = iVar3;
    uVar6 = vNodes->nSize;
    if (uVar6 == vNodes->nCap) {
      if ((int)uVar6 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc(0x80);
        }
        else {
          ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar2;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc((ulong)uVar6 << 4);
        }
        else {
          ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar6 << 4);
        }
        vNodes->pArray = ppvVar2;
        vNodes->nCap = uVar6 * 2;
      }
    }
    else {
      ppvVar2 = vNodes->pArray;
    }
    iVar3 = vNodes->nSize;
    vNodes->nSize = iVar3 + 1;
    ppvVar2[iVar3] = pObj;
  }
  return;
}

Assistant:

void Aig_ManDfsReverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Aig_ManDfsReverse_rec( p, pFanout, vNodes );
    assert( !Aig_ObjIsTravIdCurrent(p, pObj) ); // loop detection
    Aig_ObjSetTravIdCurrent(p, pObj);
    Vec_PtrPush( vNodes, pObj );
}